

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall
Corrade::Utility::String::lowercase(String *__return_storage_ptr__,String *this,StringView string)

{
  StringView view;
  size_t extraout_RDX;
  MutableStringView string_00;
  BasicStringView<char> local_48;
  String *local_38;
  char *pcStack_30;
  undefined1 local_21;
  String *pSStack_20;
  StringView string_local;
  String *out;
  
  pcStack_30 = string._data;
  local_21 = 0;
  view._sizePlusFlags = (size_t)pcStack_30;
  view._data = (char *)this;
  local_38 = this;
  pSStack_20 = this;
  string_local._data = pcStack_30;
  string_local._sizePlusFlags = (size_t)__return_storage_ptr__;
  Containers::String::String(__return_storage_ptr__,view);
  Containers::BasicStringView<char>::BasicStringView(&local_48,__return_storage_ptr__);
  string_00._sizePlusFlags = extraout_RDX;
  string_00._data = (char *)local_48._sizePlusFlags;
  lowercaseInPlace((String *)local_48._data,string_00);
  return __return_storage_ptr__;
}

Assistant:

Containers::String lowercase(const Containers::StringView string) {
    /* Theoretically doing the copy in the same loop as case change could be
       faster for *really long* strings due to cache reuse, but until that
       proves to be a bottleneck I'll go with the simpler solution.

       Not implementing through lowercase(Containers::String) as the call stack
       is deep enough already and we don't need the extra checks there. */
    Containers::String out{string};
    lowercaseInPlace(out);
    return out;
}